

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

TOK __thiscall Lexer::yylex0(Lexer *this)

{
  string *this_00;
  char *pcVar1;
  byte bVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  TOK TVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  char *pcVar14;
  TOK local_54;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->yytext;
LAB_0010d059:
  iVar7 = isspace((int)this->yychar);
  if (iVar7 != 0) {
    pcVar3 = (this->yycode)._M_dataplus._M_p;
    pcVar8 = (this->yypos)._M_current;
    sVar4 = (this->yycode)._M_string_length;
    uVar9 = this->yylineno;
    do {
      if (pcVar8 == pcVar3 + sVar4) {
        this->yychar = '\0';
        cVar11 = '\0';
      }
      else {
        pcVar14 = pcVar8 + 1;
        (this->yypos)._M_current = pcVar14;
        cVar11 = *pcVar8;
        this->yychar = cVar11;
        pcVar8 = pcVar14;
        if (cVar11 == '\n') {
          uVar9 = uVar9 + 1;
          this->yylineno = uVar9;
        }
      }
      iVar7 = isspace((int)cVar11);
    } while (iVar7 != 0);
  }
  this->yytokenlineno = this->yylineno;
  (this->yytext)._M_string_length = 0;
  *(this->yytext)._M_dataplus._M_p = '\0';
  bVar2 = this->yychar;
  if (bVar2 == 0) {
    return T_EOF_SYMBOL;
  }
  cVar11 = (char)this_00;
  std::__cxx11::string::push_back(cVar11);
  pcVar3 = (this->yycode)._M_dataplus._M_p;
  pcVar8 = (this->yypos)._M_current;
  pcVar14 = pcVar3 + (this->yycode)._M_string_length;
  if (pcVar8 == pcVar14) {
    this->yychar = '\0';
  }
  else {
    (this->yypos)._M_current = pcVar8 + 1;
    cVar12 = *pcVar8;
    this->yychar = cVar12;
    if (cVar12 == '\n') {
      this->yylineno = this->yylineno + 1;
    }
  }
  cVar12 = this->yychar;
  if (cVar12 == '{' && bVar2 == 0x25) {
    pcVar8 = (this->yypos)._M_current;
    if (pcVar8 == pcVar14) {
      this->yychar = '\0';
    }
    else {
      (this->yypos)._M_current = pcVar8 + 1;
      cVar11 = *pcVar8;
      this->yychar = cVar11;
      if (cVar11 == '\n') {
        this->yylineno = this->yylineno + 1;
      }
    }
    skip(this,'{','{','}');
    std::__cxx11::string::string
              ((string *)local_50,(string *)this_00,2,(this->yytext)._M_string_length - 4);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    TVar10 = T_TEXT;
    goto LAB_0010d303;
  }
  if ((bVar2 == 0x25) && (iVar7 = isalpha((int)cVar12), iVar7 != 0)) {
    while( true ) {
      cVar12 = this->yychar;
      iVar7 = isalnum((int)cVar12);
      if (((iVar7 == 0) && (cVar12 != '_')) && (cVar12 != '-')) break;
      std::__cxx11::string::push_back(cVar11);
      pcVar8 = (this->yypos)._M_current;
      if (pcVar8 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
        this->yychar = '\0';
      }
      else {
        (this->yypos)._M_current = pcVar8 + 1;
        cVar12 = *pcVar8;
        this->yychar = cVar12;
        if (cVar12 == '\n') {
          this->yylineno = this->yylineno + 1;
        }
      }
    }
    iVar7 = std::__cxx11::string::compare((char *)this_00);
    bVar5 = true;
    if (iVar7 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)this_00);
      if (iVar7 == 0) {
        TVar10 = T_TOKEN_TYPE;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)this_00);
        if (iVar7 == 0) {
          TVar10 = T_TOKEN;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)this_00);
          if (iVar7 == 0) {
            TVar10 = T_CLASS;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)this_00);
            TVar10 = T_ERROR;
            if (iVar7 == 0) {
              TVar10 = T_EXTENDS;
            }
          }
        }
      }
      goto LAB_0010d303;
    }
    TVar10 = T_EXTERN;
  }
  else {
    bVar5 = true;
    if (bVar2 < 0x7b) {
      switch(bVar2) {
      case 0x27:
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this_00,0,(this->yytext)._M_string_length,'\x01');
        do {
          bVar2 = this->yychar;
          if (bVar2 == 0x5c) {
            std::__cxx11::string::push_back(cVar11);
            pcVar8 = (this->yypos)._M_current;
            if (pcVar8 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar8 + 1;
              cVar12 = *pcVar8;
              this->yychar = cVar12;
              if (cVar12 == '\n') {
                this->yylineno = this->yylineno + 1;
              }
            }
            if ((this->yychar == '\0') || (this->yychar == '\n')) goto LAB_0010d4ea;
          }
          else if ((bVar2 < 0x28) && ((0x8000000401U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
          goto LAB_0010d4ea;
          std::__cxx11::string::push_back(cVar11);
          pcVar8 = (this->yypos)._M_current;
          if (pcVar8 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
            this->yychar = '\0';
          }
          else {
            (this->yypos)._M_current = pcVar8 + 1;
            cVar12 = *pcVar8;
            this->yychar = cVar12;
            if (cVar12 == '\n') {
              this->yylineno = this->yylineno + 1;
            }
          }
        } while( true );
      case 0x28:
        pcVar8 = (this->yypos)._M_current;
        if (pcVar8[-2] != '(') {
          __assert_fail("*pos == \'(\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/lexer.cc"
                        ,99,"TOK Lexer::yylex0()");
        }
        TVar10 = T_LPAREN;
        if (pcVar8 + -2 != pcVar3) {
          cVar11 = pcVar8[-3];
          iVar7 = isalnum((int)cVar11);
          if ((cVar11 == 0x5f) || (iVar7 != 0)) {
            skip(this,bVar2,'(',')');
            std::__cxx11::string::string
                      ((string *)local_50,(string *)this_00,1,(this->yytext)._M_string_length - 2);
            std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            TVar10 = T_EXTRA;
          }
          goto LAB_0010d303;
        }
        break;
      case 0x29:
        TVar10 = T_RPAREN;
        break;
      case 0x2a:
        TVar10 = T_STAR;
        break;
      case 0x2b:
        TVar10 = T_PLUS;
        break;
      case 0x2c:
        TVar10 = T_COMMA;
        break;
      case 0x2d:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3c:
      case 0x3d:
      case 0x3e:
switchD_0010d1d6_caseD_2d:
        iVar7 = isalpha((int)(char)bVar2);
        if ((bVar2 == 0x5f) || (TVar10 = T_ERROR, iVar7 != 0)) {
          iVar13 = (int)this->yychar;
          iVar7 = isalnum(iVar13);
          TVar10 = T_IDENTIFIER;
          while ((iVar13 == 0x5f || (iVar7 != 0))) {
            std::__cxx11::string::push_back(cVar11);
            pcVar8 = (this->yypos)._M_current;
            if (pcVar8 == (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
              this->yychar = '\0';
            }
            else {
              (this->yypos)._M_current = pcVar8 + 1;
              cVar12 = *pcVar8;
              this->yychar = cVar12;
              if (cVar12 == '\n') {
                this->yylineno = this->yylineno + 1;
              }
            }
            iVar13 = (int)this->yychar;
            iVar7 = isalnum(iVar13);
          }
        }
        goto LAB_0010d303;
      case 0x2f:
        TVar10 = local_54;
        if (cVar12 == '*') {
          pcVar8 = (this->yypos)._M_current;
          if (pcVar8 == pcVar14) {
            this->yychar = '\0';
          }
          else {
            (this->yypos)._M_current = pcVar8 + 1;
            cVar11 = *pcVar8;
            this->yychar = cVar11;
            if (cVar11 == '\n') {
              this->yylineno = this->yylineno + 1;
            }
          }
          if (this->yychar == '\0') goto LAB_0010d6fa;
          pcVar8 = (this->yypos)._M_current;
          uVar9 = this->yylineno;
          cVar11 = this->yychar;
          do {
            while( true ) {
              if (pcVar8 == pcVar14) {
                this->yychar = '\0';
                cVar12 = '\0';
              }
              else {
                pcVar1 = pcVar8 + 1;
                (this->yypos)._M_current = pcVar1;
                cVar12 = *pcVar8;
                this->yychar = cVar12;
                pcVar8 = pcVar1;
                if (cVar12 == '\n') {
                  uVar9 = uVar9 + 1;
                  this->yylineno = uVar9;
                }
              }
              bVar6 = cVar11 != '*';
              if (cVar12 != '/' || bVar6) break;
              if (pcVar8 == pcVar14) {
                this->yychar = '\0';
                cVar11 = '\0';
              }
              else {
                pcVar1 = pcVar8 + 1;
                (this->yypos)._M_current = pcVar1;
                cVar11 = *pcVar8;
                this->yychar = cVar11;
                pcVar8 = pcVar1;
                if (cVar11 == '\n') {
                  uVar9 = uVar9 + 1;
                  this->yylineno = uVar9;
                }
              }
              bVar5 = false;
              if (cVar12 == '/' && !bVar6 || cVar11 == '\0') goto LAB_0010d306;
            }
            bVar5 = false;
            cVar11 = cVar12;
          } while (cVar12 != '\0');
        }
        else {
          TVar10 = T_SLASH;
          if (cVar12 == '/') {
            cVar11 = this->yychar;
            uVar9 = this->yylineno;
            pcVar8 = (this->yypos)._M_current;
            while ((cVar11 != '\0' && (cVar11 != '\n'))) {
              if (pcVar8 == pcVar14) {
                this->yychar = '\0';
                cVar11 = '\0';
              }
              else {
                pcVar1 = pcVar8 + 1;
                (this->yypos)._M_current = pcVar1;
                cVar11 = *pcVar8;
                this->yychar = cVar11;
                pcVar8 = pcVar1;
                if (cVar11 == '\n') {
                  uVar9 = uVar9 + 1;
                  this->yylineno = uVar9;
                }
              }
            }
LAB_0010d6fa:
            bVar5 = false;
            TVar10 = local_54;
          }
        }
        break;
      case 0x3a:
        TVar10 = T_COLON;
        break;
      case 0x3b:
        TVar10 = T_SEMICOLON;
        break;
      case 0x3f:
        TVar10 = T_QUESTION;
        break;
      default:
        TVar10 = T_POUND;
        if (bVar2 != 0x23) goto switchD_0010d1d6_caseD_2d;
      }
    }
    else if (bVar2 == 0x7b) {
      skip(this,'{','{','}');
      bVar5 = true;
      TVar10 = T_CODE;
    }
    else {
      if (bVar2 != 0x7c) goto switchD_0010d1d6_caseD_2d;
      TVar10 = T_BAR;
    }
  }
  goto LAB_0010d306;
LAB_0010d4ea:
  TVar10 = T_ERROR;
  if (this->yychar == '\'') {
    std::__cxx11::string::push_back(cVar11);
    pcVar8 = (this->yypos)._M_current;
    if (pcVar8 != (this->yycode)._M_dataplus._M_p + (this->yycode)._M_string_length) {
      (this->yypos)._M_current = pcVar8 + 1;
      cVar11 = *pcVar8;
      this->yychar = cVar11;
      bVar5 = true;
      TVar10 = T_CHAR_LITERAL;
      if (cVar11 == '\n') {
        this->yylineno = this->yylineno + 1;
      }
      goto LAB_0010d306;
    }
    this->yychar = '\0';
    TVar10 = T_CHAR_LITERAL;
  }
LAB_0010d303:
  bVar5 = true;
LAB_0010d306:
  local_54 = TVar10;
  if (bVar5) {
    return TVar10;
  }
  goto LAB_0010d059;
}

Assistant:

TOK Lexer::yylex0() {
again:
  while (isspace(yychar)) yyinp();
  yytokenlineno = yylineno;
  yytext.clear();
  if (!yychar) return T_EOF_SYMBOL;
  auto ch = yychar;
  yytext += ch;
  yyinp();
  if (ch == '%' && yychar == '{') {
    yyinp();
    skip('{', '{', '}');
    yytext = std::string(yytext, 2, yytext.length() - 4);
    return T_TEXT;
  }
  if (ch == '%' && isalpha(yychar)) {
    while (isalnum(yychar) || yychar == '_' || yychar == '-') {
      yytext += yychar;
      yyinp();
    }
    if (yytext == "%extern") return T_EXTERN;
    if (yytext == "%token-type") return T_TOKEN_TYPE;
    if (yytext == "%token") return T_TOKEN;
    if (yytext == "%class") return T_CLASS;
    if (yytext == "%extends") return T_EXTENDS;
    return T_ERROR;
  }
  if (ch == '/') {
    if (yychar == '/') {
      for (; yychar; yyinp()) {
        if (yychar == '\n') break;
      }
      goto again;
    }
    if (yychar == '*') {
      yyinp();
      while (yychar) {
        auto ch = yychar;
        yyinp();
        if (ch == '*' && yychar == '/') {
          yyinp();
          break;
        }
      }
      goto again;
    }
    return T_SLASH;
  }
  if (ch == '\'') {
    yytext = ch;
    while (yychar && yychar != '\'' && yychar != '\n') {
      if (yychar == '\\') {
        yytext += yychar;
        yyinp();
        if (!yychar || yychar == '\n') break;
      }
      yytext += yychar;
      yyinp();
    }
    if (yychar != '\'') return T_ERROR;
    yytext += yychar;
    yyinp();
    return T_CHAR_LITERAL;
  }
  if (ch == '{') {
    skip(ch, '{', '}');
    return T_CODE;
  }
  if (ch == '(') {
    auto pos = yypos - 2;
    assert(*pos == '(');
    if (pos != yycode.cbegin() && (isalnum(pos[-1]) || pos[-1] == '_')) {
      skip(ch, '(', ')');
      yytext = std::string(yytext, 1, yytext.length() - 2);
      return T_EXTRA;
    }
    return T_LPAREN;
  }
  if (ch == '#') return T_POUND;
  if (ch == ')') return T_RPAREN;
  if (ch == '*') return T_STAR;
  if (ch == '+') return T_PLUS;
  if (ch == ',') return T_COMMA;
  if (ch == ':') return T_COLON;
  if (ch == ';') return T_SEMICOLON;
  if (ch == '?') return T_QUESTION;
  if (ch == '|') return T_BAR;
  if (isalpha(ch) || ch == '_') {
    while (isalnum(yychar) || yychar == '_') {
      yytext += yychar;
      yyinp();
    }
    return T_IDENTIFIER;
  }
  return T_ERROR;
}